

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

bool is_date(uint32_t year,Month month,uint32_t day)

{
  bool bVar1;
  bool local_1b;
  bool is_bad_day;
  bool is_valid;
  uint32_t day_local;
  Month month_local;
  uint32_t year_local;
  
  local_1b = true;
  if ((((day != 0) && ((bVar1 = is_30_day_month(month), !bVar1 || (local_1b = true, day < 0x1f))))
      && ((bVar1 = is_31_day_month(month), !bVar1 || (local_1b = true, day < 0x20)))) &&
     ((local_1b = false, month == feb &&
      ((bVar1 = leapyear(year), !bVar1 || (local_1b = true, day < 0x1e)))))) {
    bVar1 = leapyear(year);
    local_1b = !bVar1 && 0x1c < day;
  }
  bVar1 = false;
  if (0x7b1 < year) {
    bVar1 = (bool)(local_1b ^ 1);
  }
  return bVar1;
}

Assistant:

bool is_date(uint32_t year, Month month, uint32_t day)
{
	bool is_valid = year >= 1970;
	bool is_bad_day = day == 0 ||
		(
			(is_30_day_month(month) && day > 30) ||
			(is_31_day_month(month) && day > 31) ||
			(month == Month::feb && 
				((leapyear(year) && day > 29) || (!leapyear(year) && day > 28)))
			);
	is_valid = is_valid && !is_bad_day;
	return is_valid;
}